

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&,int>>
               (tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
                *matchers,
               tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int>
               *values,ostream *os)

{
  bool bVar1;
  StringMatchResultListener *this;
  ostream *in_RDX;
  ostream *in_stack_00000010;
  tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int>
  *in_stack_00000018;
  tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
  *in_stack_00000020;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  *in_stack_fffffffffffffde8;
  StringMatchResultListener *in_stack_fffffffffffffdf0;
  string local_200 [16];
  StringMatchResultListener *in_stack_fffffffffffffe10;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&,int>>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::
  get<1ul,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>
            ((tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
              *)0x209f39);
  Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
  ::Matcher((Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
             *)in_stack_fffffffffffffdf0,
            (Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
             *)in_stack_fffffffffffffde8);
  std::
  get<1ul,fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&,int>
            ((tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int>
              *)0x209f56);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe10);
  bVar1 = MatcherBase<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
          ::MatchAndExplain((MatcherBase<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
                             *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                            (MatchResultListener *)0x209f84);
  if (!bVar1) {
    in_stack_fffffffffffffdf0 =
         (StringMatchResultListener *)std::operator<<(in_RDX,"  Expected arg #");
    this = (StringMatchResultListener *)std::ostream::operator<<(in_stack_fffffffffffffdf0,1);
    std::operator<<((ostream *)this,": ");
    std::
    get<1ul,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>
              ((tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
                *)0x209fe7);
    MatcherBase<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
    ::DescribeTo((MatcherBase<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
                  *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>>
              ((SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
                *)in_stack_fffffffffffffdf0,(ostream *)this);
    StringMatchResultListener::str_abi_cxx11_(this);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::__cxx11::string::~string(local_200);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdf0);
  Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
  ::~Matcher((Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
              *)0x20a0be);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }